

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j,short *data,stbi__huffman *hdc,int b)

{
  stbi__uint32 sVar1;
  bool bVar2;
  ushort uVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  byte bVar7;
  ushort uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  long in_FS_OFFSET;
  
  if (j->spec_end != 0) {
    *(char **)(in_FS_OFFSET + -0x20) = "can\'t merge dc and ac";
    return 0;
  }
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  if (j->succ_high != 0) {
    if (j->code_bits < 1) {
      stbi__grow_buffer_unsafe(j);
    }
    if (j->code_bits < 1) {
      return 1;
    }
    sVar1 = j->code_buffer;
    j->code_buffer = sVar1 * 2;
    j->code_bits = j->code_bits + -1;
    if (-1 < (int)sVar1) {
      return 1;
    }
    *data = *data + (short)(1 << ((byte)j->succ_low & 0x1f));
    return 1;
  }
  data[0x38] = 0;
  data[0x39] = 0;
  data[0x3a] = 0;
  data[0x3b] = 0;
  data[0x3c] = 0;
  data[0x3d] = 0;
  data[0x3e] = 0;
  data[0x3f] = 0;
  data[0x30] = 0;
  data[0x31] = 0;
  data[0x32] = 0;
  data[0x33] = 0;
  data[0x34] = 0;
  data[0x35] = 0;
  data[0x36] = 0;
  data[0x37] = 0;
  data[0x28] = 0;
  data[0x29] = 0;
  data[0x2a] = 0;
  data[0x2b] = 0;
  data[0x2c] = 0;
  data[0x2d] = 0;
  data[0x2e] = 0;
  data[0x2f] = 0;
  data[0x20] = 0;
  data[0x21] = 0;
  data[0x22] = 0;
  data[0x23] = 0;
  data[0x24] = 0;
  data[0x25] = 0;
  data[0x26] = 0;
  data[0x27] = 0;
  data[0x18] = 0;
  data[0x19] = 0;
  data[0x1a] = 0;
  data[0x1b] = 0;
  data[0x1c] = 0;
  data[0x1d] = 0;
  data[0x1e] = 0;
  data[0x1f] = 0;
  data[0x10] = 0;
  data[0x11] = 0;
  data[0x12] = 0;
  data[0x13] = 0;
  data[0x14] = 0;
  data[0x15] = 0;
  data[0x16] = 0;
  data[0x17] = 0;
  data[8] = 0;
  data[9] = 0;
  data[10] = 0;
  data[0xb] = 0;
  data[0xc] = 0;
  data[0xd] = 0;
  data[0xe] = 0;
  data[0xf] = 0;
  data[0] = 0;
  data[1] = 0;
  data[2] = 0;
  data[3] = 0;
  data[4] = 0;
  data[5] = 0;
  data[6] = 0;
  data[7] = 0;
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  uVar15 = j->code_buffer;
  uVar5 = (ulong)hdc->fast[uVar15 >> 0x17];
  if (uVar5 == 0xff) {
    lVar11 = 0;
    do {
      lVar10 = lVar11;
      lVar11 = lVar10 + 1;
    } while (hdc->maxcode[lVar10 + 10] <= uVar15 >> 0x10);
    iVar9 = j->code_bits;
    if (lVar11 == 8) {
      j->code_bits = iVar9 + -0x10;
      uVar14 = 0xffffffff;
    }
    else {
      uVar14 = 0xffffffff;
      if (((int)(lVar10 + 10) <= iVar9) &&
         (uVar12 = (uVar15 >> (0x17U - (char)lVar11 & 0x1f) & stbi__bmask[lVar10 + 10]) +
                   hdc->delta[lVar10 + 10], uVar12 < 0x100)) {
        j->code_bits = (iVar9 - (int)lVar11) + -9;
        j->code_buffer = uVar15 << ((byte)(lVar10 + 10) & 0x1f);
        uVar5 = (ulong)uVar12;
        goto LAB_0011b159;
      }
    }
  }
  else {
    bVar7 = hdc->size[uVar5];
    uVar14 = 0xffffffff;
    if ((int)(uint)bVar7 <= j->code_bits) {
      j->code_buffer = uVar15 << (bVar7 & 0x1f);
      j->code_bits = j->code_bits - (uint)bVar7;
LAB_0011b159:
      uVar14 = (uint)hdc->values[uVar5];
    }
  }
  if (uVar14 < 0x10) {
    uVar15 = 0;
    if (uVar14 != 0) {
      if (j->code_bits < (int)uVar14) {
        stbi__grow_buffer_unsafe(j);
      }
      uVar15 = 0;
      if ((int)uVar14 <= j->code_bits) {
        uVar15 = j->code_buffer;
        bVar7 = (byte)uVar14 & 0x1f;
        uVar4 = uVar15 << bVar7 | uVar15 >> 0x20 - bVar7;
        uVar12 = stbi__bmask[uVar14];
        j->code_buffer = ~uVar12 & uVar4;
        j->code_bits = j->code_bits - uVar14;
        iVar9 = 0;
        if (-1 < (int)uVar15) {
          iVar9 = stbi__jbias[uVar14];
        }
        uVar15 = iVar9 + (uVar4 & uVar12);
      }
    }
    uVar14 = j->img_comp[b].dc_pred;
    if (-1 < (int)(uVar14 ^ uVar15)) {
      bVar2 = (int)uVar14 <= (int)(uVar15 ^ 0x7fffffff);
      if ((int)(uVar14 & uVar15) < 0) {
        bVar2 = (int)(-0x80000000 - uVar15) <= (int)uVar14;
      }
      if (!bVar2) {
        pcVar6 = "bad delta";
        goto LAB_0011b2f3;
      }
    }
    iVar9 = uVar14 + uVar15;
    j->img_comp[b].dc_pred = iVar9;
    bVar7 = (byte)j->succ_low;
    uVar3 = (ushort)(1 << (bVar7 & 0x1f));
    if ((ushort)(uVar3 + 1) < 2) goto LAB_0011b325;
    iVar13 = (0x10000 << (bVar7 & 0x1f)) >> 0x10;
    uVar8 = (ushort)iVar9;
    if ((short)(uVar8 ^ uVar3) < 0) {
      iVar13 = -0x8000 / iVar13;
      if ((short)uVar3 < 0) goto LAB_0011b317;
      bVar2 = iVar13 <= (short)uVar8;
    }
    else {
      iVar13 = (int)(0x7fff / (long)iVar13);
LAB_0011b317:
      bVar2 = (short)uVar8 <= iVar13;
    }
    if (bVar2) {
LAB_0011b325:
      *data = (short)(iVar9 << (bVar7 & 0x1f));
      return 1;
    }
  }
  pcVar6 = "can\'t merge dc and ac";
LAB_0011b2f3:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar6;
  return 0;
}

Assistant:

static int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j, short data[64], stbi__huffman *hdc, int b)
{
   int diff,dc;
   int t;
   if (j->spec_end != 0) return stbi__err("can't merge dc and ac", "Corrupt JPEG");

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);

   if (j->succ_high == 0) {
      // first scan for DC coefficient, must be first
      memset(data,0,64*sizeof(data[0])); // 0 all the ac values now
      t = stbi__jpeg_huff_decode(j, hdc);
      if (t < 0 || t > 15) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
      diff = t ? stbi__extend_receive(j, t) : 0;

      if (!stbi__addints_valid(j->img_comp[b].dc_pred, diff)) return stbi__err("bad delta", "Corrupt JPEG");
      dc = j->img_comp[b].dc_pred + diff;
      j->img_comp[b].dc_pred = dc;
      if (!stbi__mul2shorts_valid(dc, 1 << j->succ_low)) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
      data[0] = (short) (dc * (1 << j->succ_low));
   } else {
      // refinement scan for DC coefficient
      if (stbi__jpeg_get_bit(j))
         data[0] += (short) (1 << j->succ_low);
   }
   return 1;
}